

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_float32_t sysbvm_tuple_float32_decode(sysbvm_tuple_t tuple)

{
  _Bool _Var1;
  float result;
  uint32_t floatBits;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_tuple_t tuple_local;
  
  _Var1 = sysbvm_tuple_isNonNullPointer(tuple);
  if (_Var1) {
    tuple_local._4_4_ = *(sysbvm_float32_t *)(tuple + 0x10);
  }
  else {
    tuple_local._4_4_ = (sysbvm_float32_t)(tuple >> 4);
  }
  return tuple_local._4_4_;
}

Assistant:

SYSBVM_API float sysbvm_tuple_float32_decode(sysbvm_tuple_t tuple)
{
    if(sysbvm_tuple_isNonNullPointer(tuple))
    {
        sysbvm_object_tuple_t *floatObject = (sysbvm_object_tuple_t*)tuple;
        return *((sysbvm_float32_t*)floatObject->bytes);
    }
    else
    {
        uint32_t floatBits = (uint32_t)(tuple >> SYSBVM_TUPLE_TAG_BIT_COUNT);
        float result = 0;
        memcpy(&result, &floatBits, 4);
        return result;
    }
}